

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_utils.c
# Opt level: O0

RK_S32 mpi_enc_opt_v(void *ctx,char *next)

{
  char *pcVar1;
  MpiEncTestArgs *cmd;
  char *next_local;
  void *ctx_local;
  
  if (next == (char *)0x0) {
    ctx_local._4_4_ = 0;
  }
  else {
    pcVar1 = strstr(next,"q");
    if (pcVar1 != (char *)0x0) {
      *(undefined4 *)((long)ctx + 0xe4) = 1;
    }
    pcVar1 = strstr(next,"f");
    if (pcVar1 != (char *)0x0) {
      *(undefined4 *)((long)ctx + 0xe8) = 1;
    }
    ctx_local._4_4_ = 1;
  }
  return ctx_local._4_4_;
}

Assistant:

RK_S32 mpi_enc_opt_v(void *ctx, const char *next)
{
    MpiEncTestArgs *cmd = (MpiEncTestArgs *)ctx;

    if (next) {
        if (strstr(next, "q"))
            cmd->quiet = 1;
        if (strstr(next, "f"))
            cmd->trace_fps = 1;

        return 1;
    }

    return 0;
}